

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_free_above_context_buffers(CommonContexts *above_contexts)

{
  long *in_RDI;
  int tile_row;
  int num_planes;
  int i;
  int local_14;
  int iVar1;
  int iVar2;
  
  iVar1 = (int)in_RDI[5];
  for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0x2c); local_14 = local_14 + 1) {
    iVar2 = 0;
    while ((iVar2 < iVar1 && (in_RDI[(long)iVar2 + 1] != 0))) {
      aom_free((void *)CONCAT44(iVar2,iVar1));
      *(undefined8 *)(in_RDI[(long)iVar2 + 1] + (long)local_14 * 8) = 0;
      iVar2 = iVar2 + 1;
    }
    if (*in_RDI != 0) {
      aom_free((void *)CONCAT44(iVar2,iVar1));
      *(undefined8 *)(*in_RDI + (long)local_14 * 8) = 0;
    }
    if (in_RDI[4] != 0) {
      aom_free((void *)CONCAT44(iVar2,iVar1));
      *(undefined8 *)(in_RDI[4] + (long)local_14 * 8) = 0;
    }
  }
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    aom_free((void *)CONCAT44(iVar2,iVar1));
    in_RDI[(long)iVar2 + 1] = 0;
  }
  aom_free((void *)CONCAT44(iVar2,iVar1));
  *in_RDI = 0;
  aom_free((void *)CONCAT44(iVar2,iVar1));
  in_RDI[4] = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  return;
}

Assistant:

void av1_free_above_context_buffers(CommonContexts *above_contexts) {
  int i;
  const int num_planes = above_contexts->num_planes;

  for (int tile_row = 0; tile_row < above_contexts->num_tile_rows; tile_row++) {
    for (i = 0; i < num_planes; i++) {
      if (above_contexts->entropy[i] == NULL) break;
      aom_free(above_contexts->entropy[i][tile_row]);
      above_contexts->entropy[i][tile_row] = NULL;
    }
    if (above_contexts->partition != NULL) {
      aom_free(above_contexts->partition[tile_row]);
      above_contexts->partition[tile_row] = NULL;
    }

    if (above_contexts->txfm != NULL) {
      aom_free(above_contexts->txfm[tile_row]);
      above_contexts->txfm[tile_row] = NULL;
    }
  }
  for (i = 0; i < num_planes; i++) {
    aom_free(above_contexts->entropy[i]);
    above_contexts->entropy[i] = NULL;
  }
  aom_free(above_contexts->partition);
  above_contexts->partition = NULL;

  aom_free(above_contexts->txfm);
  above_contexts->txfm = NULL;

  above_contexts->num_tile_rows = 0;
  above_contexts->num_mi_cols = 0;
  above_contexts->num_planes = 0;
}